

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall
TorController::protocolinfo_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  Span<unsigned_char> bytes;
  string_view str;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  bool bVar1;
  undefined1 uVar2;
  pointer ppVar3;
  reference pbVar4;
  char *pcVar5;
  size_type sVar6;
  path *filename;
  size_type sVar7;
  int *in_RDX;
  TorControlConnection *in_RSI;
  long in_FS_OFFSET;
  string *s_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  iterator __end2_1;
  iterator __begin2_1;
  iterator i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  m_vec;
  iterator i;
  const_iterator __end2;
  const_iterator __begin2;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  status_cookie;
  string torpassword;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  string cookiefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  undefined4 in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  char *in_stack_fffffffffffff6e0;
  reference in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  string *in_stack_fffffffffffff708;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff710;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff718;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff720;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff728;
  LogFlags in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  int source_line;
  uchar *in_stack_fffffffffffff760;
  size_t in_stack_fffffffffffff768;
  ConstevalFormatString<2U> in_stack_fffffffffffff788;
  size_t in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a7;
  char *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff810;
  Level LVar8;
  char *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  allocator<char> local_6a1 [73];
  code *local_658;
  undefined8 local_650;
  undefined1 local_5e9;
  allocator<char> local_589 [9];
  code *local_580;
  undefined8 local_578;
  allocator<char> local_531 [40];
  allocator<char> local_509 [41];
  code *local_4e0;
  undefined8 local_4d8;
  allocator<char> local_492;
  allocator<char> local_491 [38];
  allocator<char> local_46b;
  allocator<char> local_46a;
  allocator<char> local_469 [33];
  _Base_ptr local_448;
  _Base_ptr local_440;
  _Base_ptr local_418;
  allocator<char> local_409;
  _Base_ptr local_408;
  _Base_ptr local_400;
  _Base_ptr local_3f8;
  allocator<char> local_3e9;
  _Base_ptr local_3e8;
  _Base_ptr local_3c8;
  undefined1 local_3b9 [169];
  byte local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_8;
  
  LVar8 = (Level)in_stack_fffffffffffff880;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDX == 0xfa) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    std::__cxx11::string::string(in_stack_fffffffffffff6f0);
    local_3b9._25_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff6e0);
    local_3b9._17_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff6e0);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff6e8,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff6e0), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      SplitTorReplyLine((string *)in_stack_fffffffffffff720._M_current);
      bVar1 = std::operator==(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
      if (bVar1) {
        ParseTorReplyMapping(in_stack_fffffffffffff810);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        in_stack_fffffffffffff810 = (string *)local_3b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        local_3b9._1_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff6e0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        local_3b9._9_8_ = local_3b9._1_8_;
        local_3c8 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff6e0);
        bVar1 = std::operator==((_Self *)in_stack_fffffffffffff6e8,
                                (_Self *)in_stack_fffffffffffff6e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator((allocator<char> *)local_3b9);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff6f8);
          str._M_str = (char *)in_stack_fffffffffffff718._M_current;
          str._M_len = (size_t)in_stack_fffffffffffff710._M_current;
          util::SplitString_abi_cxx11_(str,(char)((ulong)in_stack_fffffffffffff6f0 >> 0x38));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff6e0);
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff718,
                     in_stack_fffffffffffff710);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e0);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6e8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        local_3e8 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff6e0,
                           (key_type *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)
                          );
        local_3b9._9_8_ = local_3e8;
        local_3f8 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff6e0);
        bVar1 = std::operator==((_Self *)in_stack_fffffffffffff6e8,
                                (_Self *)in_stack_fffffffffffff6e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator(&local_3e9);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff6e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6e0);
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
        if (bVar1) {
          ParseTorReplyMapping(in_stack_fffffffffffff810);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                     (allocator<char> *)in_stack_fffffffffffff718._M_current);
          local_408 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffff6e0,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          local_400 = local_408;
          local_418 = (_Base_ptr)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff6e0);
          bVar1 = std::operator==((_Self *)in_stack_fffffffffffff6e8,
                                  (_Self *)in_stack_fffffffffffff6e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::allocator<char>::~allocator(&local_409);
          if ((((bVar1 ^ 0xffU) & 1) != 0) &&
             (bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6dc,
                                                   in_stack_fffffffffffff6d8),Trace), bVar1)) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            in_stack_fffffffffffff6e0 = "Connected to Tor version %s\n";
            ppVar3 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            in_stack_fffffffffffff6e8 = &ppVar3->second;
            in_stack_fffffffffffff6d8 = 1;
            logging_function._M_len._7_1_ = in_stack_fffffffffffff7a7;
            logging_function._M_len._0_7_ = in_stack_fffffffffffff7a0;
            logging_function._M_str = in_stack_fffffffffffff7a8;
            source_file._M_str = in_stack_fffffffffffff798;
            source_file._M_len = in_stack_fffffffffffff790;
            in_stack_fffffffffffff898 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6e0;
            LogPrintFormatInternal<std::__cxx11::string>
                      (logging_function,source_file,in_stack_fffffffffffff74c,
                       in_stack_fffffffffffff740,(Level)in_stack_fffffffffffff880,
                       (ConstevalFormatString<1U>)in_stack_fffffffffffff788.fmt,
                       in_stack_fffffffffffff890);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        }
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    args = &local_38;
    local_440 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6e0);
    local_448 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e0);
    while( true ) {
      bVar1 = std::operator==((_Self *)in_stack_fffffffffffff6e8,(_Self *)in_stack_fffffffffffff6e0)
      ;
      LVar8 = (Level)in_stack_fffffffffffff880;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pbVar4 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                   (char *)in_stack_fffffffffffff6f0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                   (char *)in_stack_fffffffffffff6f0);
        in_stack_fffffffffffff880 = "Supported authentication method: %s\n";
        in_stack_fffffffffffff6e0 = "Supported authentication method: %s\n";
        in_stack_fffffffffffff6d8 = 1;
        logging_function_00._M_len._7_1_ = in_stack_fffffffffffff7a7;
        logging_function_00._M_len._0_7_ = in_stack_fffffffffffff7a0;
        logging_function_00._M_str = in_stack_fffffffffffff7a8;
        source_file_00._M_str = in_stack_fffffffffffff798;
        source_file_00._M_len = in_stack_fffffffffffff790;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,in_stack_fffffffffffff74c,
                   in_stack_fffffffffffff740,0x110fa12,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffff788.fmt,args);
        in_stack_fffffffffffff6e8 = pbVar4;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
               (allocator<char> *)in_stack_fffffffffffff718._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
               (allocator<char> *)in_stack_fffffffffffff718._M_current);
    ArgsManager::GetArg((ArgsManager *)in_stack_fffffffffffff718._M_current,
                        in_stack_fffffffffffff710._M_current,in_stack_fffffffffffff708);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    std::allocator<char>::~allocator(&local_46a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    std::allocator<char>::~allocator(local_469);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                 (allocator<char> *)in_stack_fffffffffffff718._M_current);
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff6e8,(key_type *)in_stack_fffffffffffff6e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      std::allocator<char>::~allocator(local_509);
      if (sVar6 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        filename = (path *)std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)in_stack_fffffffffffff6e8,
                                   (key_type *)in_stack_fffffffffffff6e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator(local_589);
        if (filename == (path *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                     (allocator<char> *)in_stack_fffffffffffff718._M_current);
          sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6e8,(key_type *)in_stack_fffffffffffff6e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          std::allocator<char>::~allocator(local_6a1);
          if (sVar6 == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            in_stack_fffffffffffff6d8 = 2;
            logging_function_08._M_len._7_1_ = in_stack_fffffffffffff7a7;
            logging_function_08._M_len._0_7_ = in_stack_fffffffffffff7a0;
            logging_function_08._M_str = in_stack_fffffffffffff7a8;
            source_file_08._M_str = in_stack_fffffffffffff798;
            source_file_08._M_len = in_stack_fffffffffffff790;
            LogPrintFormatInternal<>
                      (logging_function_08,source_file_08,in_stack_fffffffffffff74c,
                       in_stack_fffffffffffff740,LVar8,
                       (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            in_stack_fffffffffffff6d8 = 2;
            logging_function_07._M_len._7_1_ = in_stack_fffffffffffff7a7;
            logging_function_07._M_len._0_7_ = in_stack_fffffffffffff7a0;
            logging_function_07._M_str = in_stack_fffffffffffff7a8;
            source_file_07._M_str = in_stack_fffffffffffff798;
            source_file_07._M_len = in_stack_fffffffffffff790;
            LogPrintFormatInternal<>
                      (logging_function_07,source_file_07,in_stack_fffffffffffff74c,
                       in_stack_fffffffffffff740,LVar8,
                       (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
          }
        }
        else {
          bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                                      Trace);
          source_line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff74c);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8
                       ,(char *)in_stack_fffffffffffff6f0);
            in_stack_fffffffffffff6e8 = &local_58;
            in_stack_fffffffffffff6e0 =
                 "Using SAFECOOKIE authentication, reading cookie authentication from %s\n";
            in_stack_fffffffffffff6d8 = 1;
            logging_function_04._M_len._7_1_ = in_stack_fffffffffffff7a7;
            logging_function_04._M_len._0_7_ = in_stack_fffffffffffff7a0;
            logging_function_04._M_str = in_stack_fffffffffffff7a8;
            source_file_04._M_str = in_stack_fffffffffffff798;
            source_file_04._M_len = in_stack_fffffffffffff790;
            LogPrintFormatInternal<std::__cxx11::string>
                      (logging_function_04,source_file_04,source_line,in_stack_fffffffffffff740,
                       LVar8,(ConstevalFormatString<1U>)in_stack_fffffffffffff788.fmt,args);
          }
          fs::PathFromString(in_stack_fffffffffffff708);
          ReadBinaryFile_abi_cxx11_(filename,CONCAT44(source_line,in_stack_fffffffffffff748));
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          if (((local_310 & 1) == 0) ||
             (sVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)),
             sVar7 != 0x20)) {
            if ((local_310 & 1) == 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0);
              in_stack_fffffffffffff6d8 = 2;
              logging_function_06._M_len._7_1_ = in_stack_fffffffffffff7a7;
              logging_function_06._M_len._0_7_ = in_stack_fffffffffffff7a0;
              logging_function_06._M_str = in_stack_fffffffffffff7a8;
              source_file_06._M_str = in_stack_fffffffffffff798;
              source_file_06._M_len = in_stack_fffffffffffff790;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function_06,source_file_06,source_line,in_stack_fffffffffffff740,
                         LVar8,(ConstevalFormatString<1U>)in_stack_fffffffffffff788.fmt,args);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0);
              in_stack_fffffffffffff6d8 = 2;
              logging_function_05._M_len._7_1_ = in_stack_fffffffffffff7a7;
              logging_function_05._M_len._0_7_ = in_stack_fffffffffffff7a0;
              logging_function_05._M_str = in_stack_fffffffffffff7a8;
              source_file_05._M_str = in_stack_fffffffffffff798;
              source_file_05._M_len = in_stack_fffffffffffff790;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function_05,source_file_05,source_line,in_stack_fffffffffffff740,
                         LVar8,in_stack_fffffffffffff788,args,(int *)in_stack_fffffffffffff898);
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                      (in_stack_fffffffffffff6e8);
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff708,in_stack_fffffffffffff728,in_stack_fffffffffffff720
                       ,(allocator_type *)in_stack_fffffffffffff700);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e8);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            local_5e9 = 0;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff708,(size_type)in_stack_fffffffffffff700,
                       (value_type_conflict *)in_stack_fffffffffffff6f8,
                       (allocator_type *)in_stack_fffffffffffff6f0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e0);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e8);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char> *)in_stack_fffffffffffff6e8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e0,
                       (type)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            bytes.m_size = (size_t)in_stack_fffffffffffff6e8;
            bytes.m_data = (uchar *)in_stack_fffffffffffff6e0;
            GetRandBytes(bytes);
            Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<const_unsigned_char> *)in_stack_fffffffffffff6e8,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff6e0,
                       (type)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            s_00.m_size = in_stack_fffffffffffff768;
            s_00.m_data = in_stack_fffffffffffff760;
            HexStr_abi_cxx11_(s_00);
            std::operator+((char *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
            local_658 = authchallenge_cb;
            local_650 = 0;
            std::
            bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                      ((offset_in_TorController_to_subr *)in_stack_fffffffffffff6f0,
                       (TorController **)in_stack_fffffffffffff6e8,
                       (_Placeholder<1> *)in_stack_fffffffffffff6e0,
                       (_Placeholder<2> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::function<void(TorControlConnection&,TorControlReply_const&)>::
            function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                      ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                       in_stack_fffffffffffff6f8,
                       (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                        *)in_stack_fffffffffffff6f0);
            TorControlConnection::Command
                      (in_RSI,in_stack_fffffffffffff708,(ReplyHandlerCB *)in_stack_fffffffffffff700)
            ;
            std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
                      ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
          }
          std::
          pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        }
      }
      else {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                     (char *)in_stack_fffffffffffff6f0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                     (char *)in_stack_fffffffffffff6f0);
          in_stack_fffffffffffff6e0 = "Using NULL authentication\n";
          in_stack_fffffffffffff6d8 = 1;
          logging_function_03._M_len._7_1_ = in_stack_fffffffffffff7a7;
          logging_function_03._M_len._0_7_ = in_stack_fffffffffffff7a0;
          logging_function_03._M_str = in_stack_fffffffffffff7a8;
          source_file_03._M_str = in_stack_fffffffffffff798;
          source_file_03._M_len = in_stack_fffffffffffff790;
          LogPrintFormatInternal<>
                    (logging_function_03,source_file_03,in_stack_fffffffffffff74c,
                     in_stack_fffffffffffff740,LVar8,
                     (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        local_580 = auth_cb;
        local_578 = 0;
        std::
        bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                  ((offset_in_TorController_to_subr *)in_stack_fffffffffffff6f0,
                   (TorController **)in_stack_fffffffffffff6e8,
                   (_Placeholder<1> *)in_stack_fffffffffffff6e0,
                   (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8))
        ;
        std::function<void(TorControlConnection&,TorControlReply_const&)>::
        function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                  ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                   in_stack_fffffffffffff6f8,
                   (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                    *)in_stack_fffffffffffff6f0);
        TorControlConnection::Command
                  ((TorControlConnection *)in_stack_fffffffffffff710._M_current,
                   in_stack_fffffffffffff708,(ReplyHandlerCB *)in_stack_fffffffffffff700);
        std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
                  ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator(local_531);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                 (allocator<char> *)in_stack_fffffffffffff718._M_current);
      pcVar5 = (char *)std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff6e8,(key_type *)in_stack_fffffffffffff6e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      std::allocator<char>::~allocator(&local_46b);
      if (pcVar5 == (char *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                   (char *)in_stack_fffffffffffff6f0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                   (char *)in_stack_fffffffffffff6f0);
        in_stack_fffffffffffff6d8 = 2;
        logging_function_02._M_len._7_1_ = in_stack_fffffffffffff7a7;
        logging_function_02._M_len._0_7_ = in_stack_fffffffffffff7a0;
        logging_function_02._M_str = pcVar5;
        source_file_02._M_str = in_stack_fffffffffffff798;
        source_file_02._M_len = in_stack_fffffffffffff790;
        LogPrintFormatInternal<>
                  (logging_function_02,source_file_02,in_stack_fffffffffffff74c,
                   in_stack_fffffffffffff740,LVar8,
                   (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
      }
      else {
        uVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                                    Trace);
        if ((bool)uVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                     (char *)in_stack_fffffffffffff6f0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
                     (char *)in_stack_fffffffffffff6f0);
          in_stack_fffffffffffff6e0 = "Using HASHEDPASSWORD authentication\n";
          in_stack_fffffffffffff6d8 = 1;
          logging_function_01._M_len._7_1_ = uVar2;
          logging_function_01._M_len._0_7_ = in_stack_fffffffffffff7a0;
          logging_function_01._M_str = pcVar5;
          source_file_01._M_str = in_stack_fffffffffffff798;
          source_file_01._M_len = in_stack_fffffffffffff790;
          LogPrintFormatInternal<>
                    (logging_function_01,source_file_01,in_stack_fffffffffffff74c,
                     in_stack_fffffffffffff740,LVar8,
                     (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff728._M_current,in_stack_fffffffffffff720._M_current,
                   (allocator<char> *)in_stack_fffffffffffff718._M_current);
        util::ReplaceAll(in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                         in_stack_fffffffffffff6f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator(&local_492);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::allocator<char>::~allocator(local_491);
        std::operator+(in_stack_fffffffffffff728._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff720._M_current);
        std::operator+(in_stack_fffffffffffff6f0,(char *)in_stack_fffffffffffff6e8);
        local_4e0 = auth_cb;
        local_4d8 = 0;
        std::
        bind<void(TorController::*)(TorControlConnection&,TorControlReply_const&),TorController*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                  ((offset_in_TorController_to_subr *)in_stack_fffffffffffff6f0,
                   (TorController **)in_stack_fffffffffffff6e8,
                   (_Placeholder<1> *)in_stack_fffffffffffff6e0,
                   (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8))
        ;
        std::function<void(TorControlConnection&,TorControlReply_const&)>::
        function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                  ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                   in_stack_fffffffffffff6f8,
                   (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                    *)in_stack_fffffffffffff6f0);
        TorControlConnection::Command
                  ((TorControlConnection *)in_stack_fffffffffffff710._M_current,
                   in_stack_fffffffffffff708,(ReplyHandlerCB *)in_stack_fffffffffffff700);
        std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::~function
                  ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
               (char *)in_stack_fffffffffffff6f0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6f8,
               (char *)in_stack_fffffffffffff6f0);
    logging_function_09._M_len._7_1_ = in_stack_fffffffffffff7a7;
    logging_function_09._M_len._0_7_ = in_stack_fffffffffffff7a0;
    logging_function_09._M_str = in_stack_fffffffffffff7a8;
    source_file_09._M_str = in_stack_fffffffffffff798;
    source_file_09._M_len = in_stack_fffffffffffff790;
    LogPrintFormatInternal<>
              (logging_function_09,source_file_09,in_stack_fffffffffffff74c,
               in_stack_fffffffffffff740,LVar8,
               (ConstevalFormatString<0U>)in_stack_fffffffffffff788.fmt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TorController::protocolinfo_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        std::set<std::string> methods;
        std::string cookiefile;
        /*
         * 250-AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE="/home/x/.tor/control_auth_cookie"
         * 250-AUTH METHODS=NULL
         * 250-AUTH METHODS=HASHEDPASSWORD
         */
        for (const std::string &s : reply.lines) {
            std::pair<std::string,std::string> l = SplitTorReplyLine(s);
            if (l.first == "AUTH") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("METHODS")) != m.end()) {
                    std::vector<std::string> m_vec = SplitString(i->second, ',');
                    methods = std::set<std::string>(m_vec.begin(), m_vec.end());
                }
                if ((i = m.find("COOKIEFILE")) != m.end())
                    cookiefile = i->second;
            } else if (l.first == "VERSION") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("Tor")) != m.end()) {
                    LogDebug(BCLog::TOR, "Connected to Tor version %s\n", i->second);
                }
            }
        }
        for (const std::string &s : methods) {
            LogDebug(BCLog::TOR, "Supported authentication method: %s\n", s);
        }
        // Prefer NULL, otherwise SAFECOOKIE. If a password is provided, use HASHEDPASSWORD
        /* Authentication:
         *   cookie:   hex-encoded ~/.tor/control_auth_cookie
         *   password: "password"
         */
        std::string torpassword = gArgs.GetArg("-torpassword", "");
        if (!torpassword.empty()) {
            if (methods.count("HASHEDPASSWORD")) {
                LogDebug(BCLog::TOR, "Using HASHEDPASSWORD authentication\n");
                ReplaceAll(torpassword, "\"", "\\\"");
                _conn.Command("AUTHENTICATE \"" + torpassword + "\"", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                LogPrintf("tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n");
            }
        } else if (methods.count("NULL")) {
            LogDebug(BCLog::TOR, "Using NULL authentication\n");
            _conn.Command("AUTHENTICATE", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else if (methods.count("SAFECOOKIE")) {
            // Cookie: hexdump -e '32/1 "%02x""\n"'  ~/.tor/control_auth_cookie
            LogDebug(BCLog::TOR, "Using SAFECOOKIE authentication, reading cookie authentication from %s\n", cookiefile);
            std::pair<bool,std::string> status_cookie = ReadBinaryFile(fs::PathFromString(cookiefile), TOR_COOKIE_SIZE);
            if (status_cookie.first && status_cookie.second.size() == TOR_COOKIE_SIZE) {
                // _conn.Command("AUTHENTICATE " + HexStr(status_cookie.second), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
                cookie = std::vector<uint8_t>(status_cookie.second.begin(), status_cookie.second.end());
                clientNonce = std::vector<uint8_t>(TOR_NONCE_SIZE, 0);
                GetRandBytes(clientNonce);
                _conn.Command("AUTHCHALLENGE SAFECOOKIE " + HexStr(clientNonce), std::bind(&TorController::authchallenge_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                if (status_cookie.first) {
                    LogPrintf("tor: Authentication cookie %s is not exactly %i bytes, as is required by the spec\n", cookiefile, TOR_COOKIE_SIZE);
                } else {
                    LogPrintf("tor: Authentication cookie %s could not be opened (check permissions)\n", cookiefile);
                }
            }
        } else if (methods.count("HASHEDPASSWORD")) {
            LogPrintf("tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n");
        } else {
            LogPrintf("tor: No supported authentication method\n");
        }
    } else {
        LogPrintf("tor: Requesting protocol info failed\n");
    }
}